

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

CountExpr __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_testing::NiceMock<MockNLHandler>_>::
ReadCountExpr(NLReader<mp::internal::TextReader<fmt::Locale>,_testing::NiceMock<MockNLHandler>_>
              *this)

{
  int num_args;
  CountExpr CVar1;
  CountArgHandler args;
  
  num_args = ReadNumArgs(this,1);
  MockNLHandler::OnUnhandled(&this->handler_->super_MockNLHandler,"count expression");
  NLReader<mp::internal::TextReader<fmt::Locale>,testing::NiceMock<MockNLHandler>>::
  ReadArgs<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,testing::NiceMock<MockNLHandler>>::LogicalExprReader,mp::NLHandler<MockNLHandler,BasicTestExpr<0>>::ArgHandler>
            ((NLReader<mp::internal::TextReader<fmt::Locale>,testing::NiceMock<MockNLHandler>> *)
             this,num_args,&args);
  CVar1 = NLHandler<MockNLHandler,_BasicTestExpr<0>_>::EndCount
                    ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)this->handler_);
  return (CountExpr)CVar1.id_;
}

Assistant:

typename Handler::CountExpr ReadCountExpr() {
    int num_args = ReadNumArgs(1);
    typename Handler::CountArgHandler args = handler_.BeginCount(num_args);
    ReadArgs<LogicalExprReader>(num_args, args);
    return handler_.EndCount(args);
  }